

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O0

int hdr_value_at_percentiles(hdr_histogram *h,double *percentiles,int64_t *values,size_t length)

{
  long lVar1;
  bool bVar2;
  _Bool _Var3;
  int64_t iVar4;
  long local_f0;
  double local_e8;
  _func__Bool_hdr_iter_ptr *local_e0;
  size_t at_pos;
  int64_t total;
  int64_t count_at_percentile;
  double requested_percentile;
  size_t i;
  int64_t total_count;
  hdr_iter iter;
  size_t length_local;
  int64_t *values_local;
  double *percentiles_local;
  hdr_histogram *h_local;
  
  if ((percentiles == (double *)0x0) || (values == (int64_t *)0x0)) {
    h_local._4_4_ = 0x16;
  }
  else {
    lVar1 = h->total_count;
    for (requested_percentile = 0.0; (ulong)requested_percentile < length;
        requested_percentile = (double)((long)requested_percentile + 1)) {
      if (100.0 < percentiles[(long)requested_percentile] ||
          percentiles[(long)requested_percentile] == 100.0) {
        local_e8 = 100.0;
      }
      else {
        local_e8 = percentiles[(long)requested_percentile];
      }
      local_f0 = (long)((local_e8 / 100.0) * (double)lVar1 + 0.5);
      if (local_f0 < 2) {
        local_f0 = 1;
      }
      values[(long)requested_percentile] = local_f0;
    }
    iter._next_fp = (_func__Bool_hdr_iter_ptr *)length;
    hdr_iter_init((hdr_iter *)&total_count,h);
    at_pos = 0;
    local_e0 = (_func__Bool_hdr_iter_ptr *)0x0;
    while (_Var3 = hdr_iter_next((hdr_iter *)&total_count), _Var3 && local_e0 < iter._next_fp) {
      at_pos = iter.total_count + at_pos;
      while( true ) {
        bVar2 = false;
        if (local_e0 < iter._next_fp) {
          bVar2 = values[(long)local_e0] <= (long)at_pos;
        }
        if (!bVar2) break;
        iVar4 = highest_equivalent_value(h,iter.cumulative_count);
        values[(long)local_e0] = iVar4;
        local_e0 = local_e0 + 1;
      }
    }
    h_local._4_4_ = 0;
  }
  return h_local._4_4_;
}

Assistant:

int hdr_value_at_percentiles(const struct hdr_histogram *h, const double *percentiles, int64_t *values, size_t length)
{
    if (NULL == percentiles || NULL == values)
    {
        return EINVAL;
    }

    struct hdr_iter iter;
    const int64_t total_count = h->total_count;
    // to avoid allocations we use the values array for intermediate computation
    // i.e. to store the expected cumulative count at each percentile
    for (size_t i = 0; i < length; i++)
    {
        const double requested_percentile = percentiles[i] < 100.0 ? percentiles[i] : 100.0;
        const int64_t count_at_percentile =
        (int64_t) (((requested_percentile / 100) * total_count) + 0.5);
        values[i] = count_at_percentile > 1 ? count_at_percentile : 1;
    }

    hdr_iter_init(&iter, h);
    int64_t total = 0;
    size_t at_pos = 0;
    while (hdr_iter_next(&iter) && at_pos < length)
    {
        total += iter.count;
        while (at_pos < length && total >= values[at_pos])
        {
            values[at_pos] = highest_equivalent_value(h, iter.value);
            at_pos++;
        }
    }
    return 0;
}